

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O2

void UseX_Flush_Extra_Move_Events(XEvent *event_return)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  XEvent next_event_return;
  int local_e0 [48];
  
  iVar3 = 0;
  if (event_return->type == 6) {
    iVar3 = 0;
    while( true ) {
      iVar1 = XPending(Main_Display);
      if (iVar1 == 0) break;
      XNextEvent(Main_Display,local_e0);
      if (local_e0[0] != 6) {
        XPutBackEvent(Main_Display,local_e0);
        break;
      }
      memcpy(event_return,local_e0,0xc0);
      iVar3 = iVar3 + 1;
    }
  }
  if (iVar3 != 0 && Am_Debug_Print_Input_Events != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"<> Ignoring ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    std::operator<<(poVar2," move events\n");
    std::ostream::flush();
  }
  return;
}

Assistant:

void
UseX_Flush_Extra_Move_Events(XEvent &event_return)
{
  int cnt = 0;
  if (event_return.xany.type == MotionNotify) {
    XEvent next_event_return;
    while (XPending(Main_Display)) {
      XNextEvent(Main_Display, &next_event_return);
      if (next_event_return.xany.type == MotionNotify) {
        event_return = next_event_return;
        cnt++;
      } else {
        XPutBackEvent(Main_Display, &next_event_return);
        break;
      }
    }
  }
  if (Am_Debug_Print_Input_Events && cnt > 0)
    std::cout << "<> Ignoring " << cnt << " move events\n" << std::flush;
}